

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar7;
  uint32 *puStack_a8;
  int32 var_is_full;
  uint32 *veclen;
  uint32 n_inc;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_dnom;
  uint32 n_mgau;
  uint32 n_mixw;
  float32 ***new_mixw;
  float32 ***mixw;
  float32 ***dnom;
  vector_t ****new_fullvar;
  vector_t ***new_var;
  vector_t ***new_mean;
  vector_t ****fullvar;
  vector_t ***var;
  vector_t ***mean;
  char **argv_local;
  int argc_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  argv_local._4_4_ = 0;
  fullvar = (vector_t ****)0x0;
  new_mean = (vector_t ***)0x0;
  new_fullvar = (vector_t ****)0x0;
  dnom = (float32 ***)0x0;
  mean = (vector_t ***)argv;
  argv_local._0_4_ = argc;
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-inmixwfn");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
          ,0x56,"Reading mixing weight file %s.\n",pcVar4);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-inmixwfn");
  iVar1 = s3mixw_read(pcVar4,&new_mixw,&n_dnom,&n_inc,(uint32 *)((long)&veclen + 4));
  if (iVar1 == 0) {
    pcVar3 = cmd_ln_get();
    uVar5 = cmd_ln_int_r(pcVar3,"-ninc");
    veclen._0_4_ = (uint)uVar5;
    if (veclen._4_4_ < (uint)veclen) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
              ,100,
              "# of densities to split (== %u) > total # of densities/mixture (== %u); # split <- %u # den/mix\n"
              ,uVar5 & 0xffffffff,(ulong)veclen._4_4_,CONCAT44(uVar7,veclen._4_4_));
      veclen._0_4_ = veclen._4_4_;
    }
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-inmeanfn");
    iVar1 = s3gau_read(pcVar4,&var,&n_feat,&n_inc,(uint32 *)((long)&veclen + 4),
                       &stack0xffffffffffffff58);
    if (iVar1 == 0) {
      pcVar3 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar3,"-fullvar");
      iVar1 = (int)lVar6;
      if (iVar1 == 0) {
        pcVar3 = cmd_ln_get();
        pcVar4 = cmd_ln_str_r(pcVar3,"-invarfn");
        iVar2 = s3gau_read(pcVar4,(vector_t ****)&fullvar,&n_feat,&n_inc,
                           (uint32 *)((long)&veclen + 4),&stack0xffffffffffffff58);
        if (iVar2 != 0) {
          return 1;
        }
      }
      else {
        pcVar3 = cmd_ln_get();
        pcVar4 = cmd_ln_str_r(pcVar3,"-invarfn");
        iVar2 = s3gau_read_full(pcVar4,(vector_t *****)&new_mean,&n_feat,&n_inc,
                                (uint32 *)((long)&veclen + 4),&stack0xffffffffffffff58);
        if (iVar2 != 0) {
          return 1;
        }
      }
      pcVar3 = cmd_ln_get();
      pcVar4 = cmd_ln_str_r(pcVar3,"-dcountfn");
      iVar2 = s3gaudnom_read(pcVar4,&mixw,&n_density,&n_inc,(uint32 *)((long)&veclen + 4));
      if (iVar2 == 0) {
        new_var = gauden_alloc_param(n_feat,n_inc,veclen._4_4_ + (uint)veclen,puStack_a8);
        if (iVar1 == 0) {
          new_fullvar = (vector_t ****)
                        gauden_alloc_param(n_feat,n_inc,veclen._4_4_ + (uint)veclen,puStack_a8);
        }
        else {
          dnom = (float32 ***)
                 gauden_alloc_param_full(n_feat,n_inc,veclen._4_4_ + (uint)veclen,puStack_a8);
        }
        _n_mgau = (float32 ***)
                  __ckd_calloc_3d__((ulong)n_dnom,(ulong)n_inc,(ulong)(veclen._4_4_ + (uint)veclen),
                                    4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                                    ,0x95);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                ,0x97,"output n_density == %u\n",(ulong)(veclen._4_4_ + (uint)veclen));
        inc_densities(_n_mgau,new_var,(vector_t ***)new_fullvar,(vector_t ****)dnom,new_mixw,var,
                      (vector_t ***)fullvar,(vector_t ****)new_mean,mixw,n_dnom,n_feat,n_density,
                      n_inc,veclen._4_4_,puStack_a8,(uint)veclen);
        pcVar3 = cmd_ln_get();
        pcVar4 = cmd_ln_str_r(pcVar3,"-outmixwfn");
        if (pcVar4 == (char *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                  ,0xb7,"You must use the -outmixwfn argument\n");
          exit(1);
        }
        pcVar3 = cmd_ln_get();
        pcVar4 = cmd_ln_str_r(pcVar3,"-outmixwfn");
        iVar2 = s3mixw_write(pcVar4,_n_mgau,n_dnom,n_inc,veclen._4_4_ + (uint)veclen);
        if (iVar2 == 0) {
          pcVar3 = cmd_ln_get();
          pcVar4 = cmd_ln_str_r(pcVar3,"-outmeanfn");
          if (pcVar4 == (char *)0x0) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                    ,0xc5,"You must use the -outmeanfn argument\n");
            exit(1);
          }
          pcVar3 = cmd_ln_get();
          pcVar4 = cmd_ln_str_r(pcVar3,"-outmeanfn");
          iVar2 = s3gau_write(pcVar4,new_var,n_feat,n_inc,veclen._4_4_ + (uint)veclen,puStack_a8);
          if (iVar2 == 0) {
            pcVar3 = cmd_ln_get();
            pcVar4 = cmd_ln_str_r(pcVar3,"-outvarfn");
            if (pcVar4 == (char *)0x0) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                      ,0xdf,"You must use the -outvarfn argument\n");
              exit(1);
            }
            if (iVar1 == 0) {
              pcVar3 = cmd_ln_get();
              pcVar4 = cmd_ln_str_r(pcVar3,"-outvarfn");
              iVar1 = s3gau_write(pcVar4,(vector_t ***)new_fullvar,n_feat,n_inc,
                                  veclen._4_4_ + (uint)veclen,puStack_a8);
              if (iVar1 != 0) {
                return 1;
              }
            }
            else {
              pcVar3 = cmd_ln_get();
              pcVar4 = cmd_ln_str_r(pcVar3,"-outvarfn");
              iVar1 = s3gau_write_full(pcVar4,(vector_t ****)dnom,n_feat,n_inc,
                                       veclen._4_4_ + (uint)veclen,puStack_a8);
              if (iVar1 != 0) {
                return 1;
              }
            }
            argv_local._4_4_ = 0;
          }
          else {
            argv_local._4_4_ = 1;
          }
        }
        else {
          argv_local._4_4_ = 1;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
    vector_t ***mean;
    vector_t ***var = NULL;
    vector_t ****fullvar = NULL;
    vector_t ***new_mean;
    vector_t ***new_var = NULL;
    vector_t ****new_fullvar = NULL;
    float32  ***dnom;
    float32 ***mixw;
    float32 ***new_mixw;
    uint32 n_mixw;
    uint32 n_mgau;
    uint32 n_dnom;
    uint32 n_feat;
    uint32 n_density;
    uint32 n_inc;
    uint32 *veclen;
    int32 var_is_full;

    parse_cmd_ln(argc, argv);

    E_INFO("Reading mixing weight file %s.\n",
	   cmd_ln_str("-inmixwfn"));

    if (s3mixw_read(cmd_ln_str("-inmixwfn"),
		    &mixw,
		    &n_mixw,
		    &n_feat,
		    &n_density) != S3_SUCCESS) {
	return 1;
    }

    n_inc = cmd_ln_int32("-ninc");

    if (n_inc > n_density) {
	E_WARN("# of densities to split (== %u) > total # of densities/mixture (== %u); # split <- %u # den/mix\n",
	       n_inc, n_density, n_density);
	n_inc = n_density;
    }
    
    if (s3gau_read(cmd_ln_str("-inmeanfn"),
		   &mean,
		   &n_mgau,
		   &n_feat,
		   &n_density,
		   &veclen) != S3_SUCCESS) {
	return 1;
    }

    var_is_full = cmd_ln_int32("-fullvar");
    if (var_is_full) {
	if (s3gau_read_full(cmd_ln_str("-invarfn"),
			    &fullvar,
			    &n_mgau,
			    &n_feat,
			    &n_density,
			    &veclen) != S3_SUCCESS) {
	    return 1;
	}
    }
    else {
	if (s3gau_read(cmd_ln_str("-invarfn"),
		       &var,
		       &n_mgau,
		       &n_feat,
		       &n_density,
		       &veclen) != S3_SUCCESS) {
	    return 1;
	}
    }

    if (s3gaudnom_read(cmd_ln_str("-dcountfn"),
		       &dnom,
		       &n_dnom,
		       &n_feat,
		       &n_density) != S3_SUCCESS) {
	return 1;
    }
	
    new_mean = gauden_alloc_param(n_mgau, n_feat, n_density+n_inc, veclen);
    if (var_is_full)
	    new_fullvar  = gauden_alloc_param_full(n_mgau, n_feat, n_density+n_inc, veclen);
    else
	    new_var  = gauden_alloc_param(n_mgau, n_feat, n_density+n_inc, veclen);
    new_mixw = (float32 ***)ckd_calloc_3d(n_mixw, n_feat, n_density+n_inc,
					  sizeof(float32));
    
    E_INFO("output n_density == %u\n", n_density+n_inc);

    inc_densities(new_mixw,
		  new_mean,
		  new_var,
		  new_fullvar,

		  mixw,
		  mean,
		  var,
		  fullvar,
		  dnom,

		  n_mixw,
		  n_mgau,
		  n_dnom,
		  n_feat,
		  n_density,
		  veclen,

		  n_inc);

    if (cmd_ln_str("-outmixwfn") != NULL) {
	if (s3mixw_write(cmd_ln_str("-outmixwfn"),
			 new_mixw,
			 n_mixw,
			 n_feat,
			 n_density+n_inc) != S3_SUCCESS) {
	    return 1;
	}
    }
    else {
	E_FATAL("You must use the -outmixwfn argument\n");
    }

    if (cmd_ln_str("-outmeanfn") != NULL) {
	if (s3gau_write(cmd_ln_str("-outmeanfn"),
			(const vector_t ***)new_mean,
			n_mgau,
			n_feat,
			n_density+n_inc,
			veclen) != S3_SUCCESS) {
	    return 1;
	}
    }
    else {
	E_FATAL("You must use the -outmeanfn argument\n");
    }

    if (cmd_ln_str("-outvarfn") != NULL) {
	if (var_is_full) {
	    if (s3gau_write_full(cmd_ln_str("-outvarfn"),
				 (const vector_t ****)new_fullvar,
				 n_mgau,
				 n_feat,
				 n_density+n_inc,
				 veclen) != S3_SUCCESS) {
		return 1;
	    }
	}
	else {
	    if (s3gau_write(cmd_ln_str("-outvarfn"),
			    (const vector_t ***)new_var,
			    n_mgau,
			    n_feat,
			    n_density+n_inc,
			    veclen) != S3_SUCCESS) {
		return 1;
	    }
	}
    }
    else {
	E_FATAL("You must use the -outvarfn argument\n");
    }

    return 0;
}